

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  _Alloc_hider _Var5;
  int total;
  int pp;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  Arguments args;
  FileDataSource input;
  
  args.type._M_dataplus._M_p = (pointer)&args.type.field_2;
  args.type._M_string_length = 0;
  args.type.field_2._M_local_buf[0] = '\0';
  args.inputFile._M_dataplus._M_p = (pointer)&args.inputFile.field_2;
  args.inputFile._M_string_length = 0;
  args.inputFile.field_2._M_local_buf[0] = '\0';
  args.codepage._M_dataplus._M_p = (pointer)&args.codepage.field_2;
  args.codepage._M_string_length = 0;
  args.codepage.field_2._M_local_buf[0] = '\0';
  bVar1 = handle_command_args(argc,argv,&args);
  if (bVar1) {
    csv::icu::FileDataSource::FileDataSource(&input);
    _Var5._M_p = (pointer)args.codepage._M_string_length;
    if (args.codepage._M_string_length != 0) {
      _Var5 = args.codepage._M_dataplus;
    }
    iVar3 = csv::icu::FileDataSource::open(&input,args.inputFile._M_dataplus._M_p,(int)_Var5._M_p);
    if ((char)iVar3 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to open file");
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(-1);
    }
    bVar2 = std::operator==(&args.type,"tsv");
    bVar1 = args.verbose;
    if (bVar2) {
      input.super_DataSource.super_IDataSource._12_4_ = 9;
    }
    if (args.separator != 0x2c) {
      input.super_DataSource.super_IDataSource._12_4_ = (int)args.separator;
    }
    pp = -1;
    total = 0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    local_128 = (code *)0x0;
    pcStack_120 = (code *)0x0;
    local_138._M_unused._M_object = operator_new(0x20);
    *(int **)local_138._M_unused._0_8_ = &pp;
    *(bool *)((long)local_138._M_unused._0_8_ + 8) = bVar1;
    *(size_t *)((long)local_138._M_unused._0_8_ + 0x10) = args.limit;
    *(int **)((long)local_138._M_unused._0_8_ + 0x18) = &total;
    pcStack_120 = std::
                  _Function_handler<bool_(const_csv::record_&,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dagronf[P]csvlib/tools/csv_command_line/main.cpp:63:21)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<bool_(const_csv::record_&,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dagronf[P]csvlib/tools/csv_command_line/main.cpp:63:21)>
                ::_M_manager;
    csv::parse((IDataSource *)&input,(FieldCallback *)&local_118,(RecordCallback *)&local_138);
    std::_Function_base::~_Function_base((_Function_base *)&local_138);
    std::_Function_base::~_Function_base((_Function_base *)&local_118);
    if (args.verbose == true) {
      anon_unknown.dwarf_32dd::PrintProgress(1.0,(long)total);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    csv::icu::FileDataSource::~FileDataSource(&input);
    iVar3 = 0;
  }
  else {
    iVar3 = -1;
  }
  Arguments::~Arguments(&args);
  return iVar3;
}

Assistant:

int main(int argc, const char * argv[]) {

	// Wrap everything in a try block.  Do this every time,
	// because exceptions will be thrown for problems.
	Arguments args;
	if (handle_command_args(argc, argv, args) == false) {
		return -1;
	}

	csv::icu::FileDataSource input;
	if (!input.open(args.inputFile.c_str(), args.codepage.length() > 0 ? args.codepage.c_str() : NULL)) {
		cerr << "Unable to open file" << endl;
		exit(-1);
	}

	if (args.type == "tsv") {
		input.separator = '\t';
	}

	if (args.separator != ',') {
		input.separator = args.separator;
	}

	int pp = -1;
	int total = 0;

	bool verbose = args.verbose;
	size_t limit = args.limit;

	auto recordAdder = [&pp, verbose, limit, &total](const csv::record& record, double complete) -> bool {

		if (total > 0) {
			cout << "\n";
		}

		total += 1;
		if (verbose && (int)(complete*100) != pp) {
			pp = (int)(complete*100);
			PrintProgress(complete, record.row);
		}

		bool lineStarted = false;
		for (const auto& field : record.content) {
			if (lineStarted) {
				lineStarted = true;
				cout << "\t";
			}
			std::string fieldValue = field.content;
			ReplaceStringInPlace(fieldValue, "\"", "\"\"");
			cout << "\"" << fieldValue << "\"\t";
		}

		if (limit > 0 && record.row == limit - 1) {
			PrintProgress(1.0, record.row + 1);
			return false;
		}

		// Only flush every 1000 records
		if ((total % 10000) == 0) {
			cout << flush;
		}

		return true;
	};
	csv::parse(input, NULL, recordAdder);

	if (args.verbose) {
		PrintProgress(1, total);
		cerr << endl;
	}

	return 0;
}